

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O1

int Mpm_CutComputeDsd6(Mpm_Man_t *p,Mpm_Cut_t *pCut,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,
                      Mpm_Cut_t *pCutC,int fCompl0,int fCompl1,int fComplC,int Type)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  word wVar10;
  word wVar11;
  word *pwVar12;
  word *pwVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint local_48 [6];
  
  local_48[0] = 0xffffffff;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  local_48[5] = 0xffffffff;
  uVar4 = *(uint *)&pCut0->field_0x4;
  uVar15 = uVar4 >> 1 & 0xffffff;
  uVar8 = *(uint *)&pCut1->field_0x4;
  uVar3 = uVar8 >> 1 & 0xffffff;
  if (pCutC == (Mpm_Cut_t *)0x0) {
    uVar1 = p->uPermMask[1];
    if (((long)(int)uVar1 < 0) || (p->vMap2Perm->nSize <= (int)uVar1)) goto LAB_00885fb3;
    uVar3 = uVar3 * 0x2d0 + p->vMap2Perm->pArray[(int)uVar1];
    if (((int)uVar3 < 0) || (p->vPerm6->nSize <= (int)uVar3)) goto LAB_00885fd2;
    wVar10 = p->vPerm6->pArray[uVar3];
    if (p->uComplMask[1] != 0) {
      pwVar13 = s_Truths6;
      lVar6 = 0;
      do {
        if ((p->uComplMask[1] >> ((uint)lVar6 & 0x1f) & 1) != 0) {
          bVar7 = (byte)(1 << ((byte)lVar6 & 0x1f));
          wVar10 = (*pwVar13 & wVar10) >> (bVar7 & 0x3f) | wVar10 << (bVar7 & 0x3f) & *pwVar13;
        }
        lVar6 = lVar6 + 1;
        pwVar13 = pwVar13 + 1;
      } while (lVar6 != 6);
    }
    uVar16 = *(ulong *)((long)&p->pDsd6->uTruth + (ulong)(uVar15 << 5)) ^
             -(ulong)(((uVar4 >> 0x19 ^ uVar4) & 1) != fCompl0);
    uVar14 = -(ulong)(((uVar8 >> 0x19 ^ uVar8) & 1) != fCompl1) ^ wVar10;
    if (Type == 2) {
      wVar10 = uVar14 ^ uVar16;
    }
    else {
      if (Type != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                      ,0x3bc,
                      "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
      wVar10 = uVar14 & uVar16;
    }
  }
  else {
    uVar1 = p->uPermMask[1];
    if ((long)(int)uVar1 < 0) {
LAB_00885fb3:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar5 = p->vMap2Perm->nSize;
    if (iVar5 <= (int)uVar1) goto LAB_00885fb3;
    uVar9 = p->uPermMask[2];
    if (((long)(int)uVar9 < 0) || (iVar5 <= (int)uVar9)) goto LAB_00885fb3;
    piVar2 = p->vMap2Perm->pArray;
    uVar3 = uVar3 * 0x2d0 + piVar2[(int)uVar1];
    if ((int)uVar3 < 0) {
LAB_00885fd2:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                    ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    iVar5 = p->vPerm6->nSize;
    if (iVar5 <= (int)uVar3) goto LAB_00885fd2;
    uVar1 = *(uint *)&pCutC->field_0x4;
    uVar9 = (uVar1 >> 1 & 0xffffff) * 0x2d0 + piVar2[(int)uVar9];
    if (((int)uVar9 < 0) || (iVar5 <= (int)uVar9)) goto LAB_00885fd2;
    pwVar13 = p->vPerm6->pArray;
    wVar10 = pwVar13[uVar3];
    if (p->uComplMask[1] != 0) {
      pwVar12 = s_Truths6;
      lVar6 = 0;
      do {
        if ((p->uComplMask[1] >> ((uint)lVar6 & 0x1f) & 1) != 0) {
          bVar7 = (byte)(1 << ((byte)lVar6 & 0x1f));
          wVar10 = (*pwVar12 & wVar10) >> (bVar7 & 0x3f) | wVar10 << (bVar7 & 0x3f) & *pwVar12;
        }
        lVar6 = lVar6 + 1;
        pwVar12 = pwVar12 + 1;
      } while (lVar6 != 6);
    }
    wVar11 = pwVar13[uVar9];
    if (p->uComplMask[2] != 0) {
      pwVar13 = s_Truths6;
      lVar6 = 0;
      do {
        if ((p->uComplMask[2] >> ((uint)lVar6 & 0x1f) & 1) != 0) {
          bVar7 = (byte)(1 << ((byte)lVar6 & 0x1f));
          wVar11 = (*pwVar13 & wVar11) >> (bVar7 & 0x3f) | wVar11 << (bVar7 & 0x3f) & *pwVar13;
        }
        lVar6 = lVar6 + 1;
        pwVar13 = pwVar13 + 1;
      } while (lVar6 != 6);
    }
    uVar16 = *(ulong *)((long)&p->pDsd6->uTruth + (ulong)(uVar15 << 5)) ^
             -(ulong)(((uVar4 >> 0x19 ^ uVar4) & 1) != fCompl0);
    wVar10 = (wVar10 ^ -(ulong)(((uVar8 >> 0x19 ^ uVar8) & 1) != fCompl1) ^ uVar16) &
             (-(ulong)((uVar1 >> 0x19 & 1 ^ fComplC) != (uVar1 & 1)) ^ wVar11) ^ uVar16;
  }
  uVar4 = Mpm_CutCheckDsd6(p,wVar10);
  if (uVar4 == 0xffffffff) {
    p->nNonDsd = p->nNonDsd + 1;
LAB_00885f64:
    iVar5 = 0;
  }
  else {
    uVar8 = (int)uVar4 >> 0x11;
    if (p->pPars->fMap4Gates != 0) {
      if (((int)uVar8 < 0) || (p->vNpnConfigs->nSize <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (p->vNpnConfigs->pArray[uVar8].nSize == 0) {
        p->nNoMatch = p->nNoMatch + 1;
        goto LAB_00885f64;
      }
    }
    if ((int)uVar8 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    uVar3 = uVar4 & 0xffff;
    uVar4 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar4 >> 0x10 & 1) + uVar8 * 2;
    *(uint *)&pCut->field_0x4 = uVar4;
    if (0xb3ff < uVar3) {
      __assert_fail("(Config >> 6) < 720",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                    ,0x405,
                    "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                   );
    }
    if (0x7ffffff < uVar4) {
      uVar16 = 0;
      do {
        if (pCut->pLeaves[uVar16] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        local_48[p->Perm6[uVar3 >> 6][uVar16]] =
             pCut->pLeaves[uVar16] ^ (uint)((uVar3 >> ((uint)uVar16 & 0x1f) & 1) != 0);
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar4 >> 0x1b);
    }
    uVar3 = p->pDsd6[uVar8].nVars;
    *(uint *)&pCut->field_0x4 = uVar4 & 0x7ffffff | uVar3 << 0x1b;
    if ((uVar3 & 0x1f) != 0) {
      uVar16 = 0;
      do {
        if (local_48[uVar16] == 0xffffffff) {
          __assert_fail("pLeavesNew[i] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                        ,0x40a,
                        "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                       );
        }
        uVar16 = uVar16 + 1;
      } while (((ulong)uVar3 & 0x1f) != uVar16);
      memcpy(pCut->pLeaves,local_48,(ulong)((uVar3 & 0x1f) << 2));
    }
    p->nCountDsd[uVar8] = p->nCountDsd[uVar8] + 1;
    p->nSmallSupp = p->nSmallSupp + (uint)(*(uint *)&pCut->field_0x4 < 0x10000000);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int Mpm_CutComputeDsd6( Mpm_Man_t * p, Mpm_Cut_t * pCut, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, int Type )
{
    int fVerbose = 0;
    int i, Config, iClass, fCompl;
    int pLeavesNew[6] = { -1, -1, -1, -1, -1, -1 };
    word t = 0;
    if ( pCutC == NULL )
    {
        word t0, t1;
        int iClass0  = Abc_Lit2Var(pCut0->iFunc);
        int iClass1  = Abc_Lit2Var(pCut1->iFunc);
        word Truth0  = p->pDsd6[iClass0].uTruth;
        int Perm1    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[1] );
        word Truth1p = Vec_WrdEntry( p->vPerm6, iClass1 * 720 + Perm1 );
        if ( p->uComplMask[1] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[1] >> i) & 1 )
                    Truth1p = Abc_Tt6Flip( Truth1p, i );            
        }
        t0 = (fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iFunc)) ? ~Truth0  : Truth0;
        t1 = (fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iFunc)) ? ~Truth1p : Truth1p;
        if ( Type == 1 )
            t = t0 & t1;
        else if ( Type == 2 )
            t = t0 ^ t1;
        else assert( 0 );

if ( fVerbose )
{
Mpm_ManPrintPerm( p->uPermMask[1] );               printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth0, 6 );   printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth1p, 6 );  printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );        printf( "\n" );
}
    }
    else
    {
        word t0, t1, tC;
        int iClass0  = Abc_Lit2Var(pCut0->iFunc);
        int iClass1  = Abc_Lit2Var(pCut1->iFunc);
        int iClassC  = Abc_Lit2Var(pCutC->iFunc);
        word Truth0  = p->pDsd6[iClass0].uTruth;
        int Perm1    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[1] );
        int PermC    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[2] );
        word Truth1p = Vec_WrdEntry( p->vPerm6, iClass1 * 720 + Perm1 );
        word TruthCp = Vec_WrdEntry( p->vPerm6, iClassC * 720 + PermC );
        if ( p->uComplMask[1] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[1] >> i) & 1 )
                    Truth1p = Abc_Tt6Flip( Truth1p, i );            
        }
        if ( p->uComplMask[2] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[2] >> i) & 1 )
                    TruthCp = Abc_Tt6Flip( TruthCp, i );            
        }
        t0 = (fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iFunc)) ? ~Truth0  : Truth0;
        t1 = (fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iFunc)) ? ~Truth1p : Truth1p;
        tC = (fComplC ^ pCutC->fCompl ^ Abc_LitIsCompl(pCutC->iFunc)) ? ~TruthCp : TruthCp;
        t = (tC & t1) | (~tC & t0);
    }

    // find configuration
    Config = Mpm_CutCheckDsd6( p, t );
    if ( Config == -1 )
    {
        p->nNonDsd++;
        return 0;
    }

    // get the class
    iClass = Config >> 17;
    fCompl = (Config >> 16) & 1;
    Config &= 0xFFFF;

    // check if the gate exists
    if ( p->pPars->fMap4Gates )
    {
        if ( Vec_IntSize(Vec_WecEntry(p->vNpnConfigs, iClass)) == 0 )
        {
            p->nNoMatch++;
            return 0;
        }
    }

    // set the function
    pCut->iFunc = Abc_Var2Lit( iClass, fCompl );

if ( fVerbose )
{
Mpm_CutPrint( pCut0 );
Mpm_CutPrint( pCut1 );
Mpm_CutPrint( pCut );
}

    // update cut
    assert( (Config >> 6) < 720 );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pLeavesNew[(int)(p->Perm6[Config >> 6][i])] = Abc_LitNotCond( pCut->pLeaves[i], (Config >> i) & 1 );
    pCut->nLeaves = p->pDsd6[iClass].nVars;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        assert( pLeavesNew[i] != -1 );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pCut->pLeaves[i] = pLeavesNew[i];
    p->nCountDsd[iClass]++;
    p->nSmallSupp += (int)(pCut->nLeaves < 2);

if ( fVerbose )
{
printf( "Computed " );
Mpm_CutPrint( pCut );
printf( "\n" );
}
    return 1;
}